

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

mipmapped_texture * __thiscall
crnlib::mipmapped_texture::operator=(mipmapped_texture *this,mipmapped_texture *rhs)

{
  face_vec *this_00;
  uint uVar1;
  void *p;
  mip_level *rhs_00;
  uint uVar2;
  component_flags cVar3;
  pixel_format pVar4;
  uint uVar5;
  mip_level *this_01;
  vector<crnlib::mip_level_*> *pvVar6;
  uint uVar7;
  vector<crnlib::mip_level_*> *this_02;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (this != rhs) {
    clear(this);
    dynamic_string::set(&this->m_name,&rhs->m_name,0xffffffff);
    uVar2 = rhs->m_height;
    cVar3 = rhs->m_comp_flags;
    pVar4 = rhs->m_format;
    this->m_width = rhs->m_width;
    this->m_height = uVar2;
    this->m_comp_flags = cVar3;
    this->m_format = pVar4;
    this_00 = &this->m_faces;
    uVar1 = (rhs->m_faces).m_size;
    uVar5 = (this->m_faces).m_size;
    uVar7 = uVar5 - uVar1;
    if (uVar7 != 0) {
      if (uVar5 < uVar1 || uVar7 == 0) {
        if ((this->m_faces).m_capacity < uVar1) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar1,uVar5 + 1 == uVar1,0x10,(object_mover)0x0,
                     false);
          uVar5 = (this->m_faces).m_size;
        }
        if (uVar1 - uVar5 != 0) {
          memset(this_00->m_p + uVar5,0,(ulong)(uVar1 - uVar5) << 4);
        }
      }
      else {
        pvVar6 = this_00->m_p;
        lVar8 = 0;
        do {
          p = *(void **)((long)&pvVar6[uVar1].m_p + lVar8);
          if (p != (void *)0x0) {
            crnlib_free(p);
          }
          lVar8 = lVar8 + 0x10;
        } while ((ulong)uVar7 << 4 != lVar8);
      }
      (this->m_faces).m_size = uVar1;
    }
    if (uVar1 != 0) {
      pvVar6 = (rhs->m_faces).m_p;
      uVar10 = 0;
      do {
        uVar1 = pvVar6[uVar10].m_size;
        uVar5 = this_00->m_p[uVar10].m_size;
        this_02 = this_00->m_p + uVar10;
        if (uVar5 != uVar1) {
          if (uVar5 <= uVar1) {
            if (this_02->m_capacity < uVar1) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)this_02,uVar1,uVar5 + 1 == uVar1,8,(object_mover)0x0,
                         false);
              uVar5 = this_02->m_size;
            }
            memset(this_02->m_p + uVar5,0,(ulong)(uVar1 - uVar5) << 3);
            pvVar6 = (rhs->m_faces).m_p;
          }
          this_02->m_size = uVar1;
        }
        if (pvVar6[uVar10].m_size != 0) {
          uVar9 = 0;
          do {
            rhs_00 = pvVar6[uVar10].m_p[uVar9];
            this_01 = (mip_level *)crnlib_malloc(0x28);
            this_01->m_width = 0;
            this_01->m_height = 0;
            this_01->m_comp_flags = cDefaultCompFlags;
            *(undefined8 *)&this_01->m_format = 0;
            *(undefined8 *)((long)&this_01->m_pImage + 4) = 0;
            *(undefined8 *)((long)&this_01->m_pDXTImage + 4) = 0;
            mip_level::operator=(this_01,rhs_00);
            this_00->m_p[uVar10].m_p[uVar9] = this_01;
            uVar9 = uVar9 + 1;
            pvVar6 = (rhs->m_faces).m_p;
          } while (uVar9 < pvVar6[uVar10].m_size);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (this->m_faces).m_size);
    }
  }
  return this;
}

Assistant:

mipmapped_texture& mipmapped_texture::operator=(const mipmapped_texture& rhs) {
  if (this == &rhs)
    return *this;

  clear();

  m_name = rhs.m_name;
  m_width = rhs.m_width;
  m_height = rhs.m_height;

  m_comp_flags = rhs.m_comp_flags;
  m_format = rhs.m_format;

  m_faces.resize(rhs.m_faces.size());
  for (uint i = 0; i < m_faces.size(); i++) {
    m_faces[i].resize(rhs.m_faces[i].size());

    for (uint j = 0; j < rhs.m_faces[i].size(); j++)
      m_faces[i][j] = crnlib_new<mip_level>(*rhs.m_faces[i][j]);
  }

  CRNLIB_ASSERT((!is_valid()) || check());

  return *this;
}